

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O0

bool __thiscall
wallet::WalletBatch::WriteCryptedKey
          (WalletBatch *this,CPubKey *vchPubKey,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *vchCryptedSecret,
          CKeyMetadata *keyMeta)

{
  bool bVar1;
  undefined1 uVar2;
  byte bVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDX;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CPubKey>
  *in_RSI;
  WalletBatch *in_RDI;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> val;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CPubKey> key
  ;
  uint256 checksum;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CPubKey>
  *in_stack_fffffffffffffe18;
  undefined5 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe25;
  byte in_stack_fffffffffffffe26;
  undefined1 in_stack_fffffffffffffe27;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CPubKey>
  *in_stack_fffffffffffffe28;
  undefined5 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe35;
  undefined1 in_stack_fffffffffffffe36;
  undefined1 in_stack_fffffffffffffe37;
  undefined8 in_stack_fffffffffffffe38;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CPubKey>
  *key_00;
  undefined4 in_stack_fffffffffffffe48;
  int iVar4;
  undefined4 in_stack_fffffffffffffe4c;
  WalletBatch *in_stack_fffffffffffffe50;
  WalletBatch *this_00;
  byte local_181;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CPubKey>
  local_180 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar1 = WriteKeyMetadata(in_stack_fffffffffffffe50,
                           (CKeyMetadata *)
                           CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                           (CPubKey *)in_RDI,SUB81((ulong)in_stack_fffffffffffffe38 >> 0x38,0));
  if (!bVar1) {
    local_181 = 0;
    goto LAB_00b62f73;
  }
  key_00 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CPubKey>
            *)&stack0xffffffffffffffd8;
  Hash<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  std::make_pair<std::__cxx11::string_const&,CPubKey_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffe27,
                      CONCAT16(in_stack_fffffffffffffe26,
                               CONCAT15(in_stack_fffffffffffffe25,in_stack_fffffffffffffe20))),
             (CPubKey *)in_stack_fffffffffffffe18);
  std::make_pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const&,uint256&>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffe27,
                      CONCAT16(in_stack_fffffffffffffe26,
                               CONCAT15(in_stack_fffffffffffffe25,in_stack_fffffffffffffe20))),
             (uint256 *)in_stack_fffffffffffffe18);
  uVar2 = WriteIC<std::pair<std::__cxx11::string,CPubKey>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,uint256>>
                    (in_RDI,key_00,
                     (pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_uint256> *)
                     CONCAT17(in_stack_fffffffffffffe37,
                              CONCAT16(in_stack_fffffffffffffe36,
                                       CONCAT15(in_stack_fffffffffffffe35,in_stack_fffffffffffffe30)
                                      )),SUB81((ulong)in_stack_fffffffffffffe28 >> 0x38,0));
  bVar3 = uVar2 ^ 0xff;
  std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_uint256>::~pair
            ((pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_uint256> *)
             in_stack_fffffffffffffe18);
  if ((bVar3 & 1) == 0) {
LAB_00b62ee9:
    std::make_pair<std::__cxx11::string_const&,CPubKey_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffe27,
                        CONCAT16(in_stack_fffffffffffffe26,
                                 CONCAT15(in_stack_fffffffffffffe25,in_stack_fffffffffffffe20))),
               (CPubKey *)in_stack_fffffffffffffe18);
    EraseIC<std::pair<std::__cxx11::string,CPubKey>>
              ((WalletBatch *)
               CONCAT17(uVar2,CONCAT16(bVar3,CONCAT15(in_stack_fffffffffffffe35,
                                                      in_stack_fffffffffffffe30))),
               in_stack_fffffffffffffe28);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CPubKey>::
    ~pair(in_stack_fffffffffffffe18);
    local_181 = 1;
  }
  else {
    in_stack_fffffffffffffe28 = local_180;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe18);
    std::unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>::operator->
              ((unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_> *)
               in_stack_fffffffffffffe18);
    in_stack_fffffffffffffe35 =
         DatabaseBatch::
         Read<std::pair<std::__cxx11::string,CPubKey>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ((DatabaseBatch *)this_00,in_RSI,in_RDX);
    if ((bool)in_stack_fffffffffffffe35) {
      std::make_pair<std::vector<unsigned_char,std::allocator<unsigned_char>>&,uint256&>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT17(in_stack_fffffffffffffe27,
                          CONCAT16(in_stack_fffffffffffffe26,
                                   CONCAT15(in_stack_fffffffffffffe25,in_stack_fffffffffffffe20))),
                 (uint256 *)in_stack_fffffffffffffe18);
      in_stack_fffffffffffffe27 =
           WriteIC<std::pair<std::__cxx11::string,CPubKey>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,uint256>>
                     (in_RDI,key_00,
                      (pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_uint256> *)
                      CONCAT17(uVar2,CONCAT16(bVar3,CONCAT15(in_stack_fffffffffffffe35,
                                                             in_stack_fffffffffffffe30))),
                      SUB81((ulong)in_stack_fffffffffffffe28 >> 0x38,0));
      in_stack_fffffffffffffe26 = in_stack_fffffffffffffe27 ^ 0xff;
      std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_uint256>::~pair
                ((pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_uint256> *)
                 in_stack_fffffffffffffe18);
      if ((in_stack_fffffffffffffe26 & 1) == 0) {
        iVar4 = 0;
      }
      else {
        local_181 = 0;
        iVar4 = 1;
      }
    }
    else {
      local_181 = 0;
      iVar4 = 1;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe28);
    if (iVar4 == 0) goto LAB_00b62ee9;
  }
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CPubKey>::
  ~pair(in_stack_fffffffffffffe18);
LAB_00b62f73:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_181 & 1);
}

Assistant:

bool WalletBatch::WriteCryptedKey(const CPubKey& vchPubKey,
                                const std::vector<unsigned char>& vchCryptedSecret,
                                const CKeyMetadata &keyMeta)
{
    if (!WriteKeyMetadata(keyMeta, vchPubKey, true)) {
        return false;
    }

    // Compute a checksum of the encrypted key
    uint256 checksum = Hash(vchCryptedSecret);

    const auto key = std::make_pair(DBKeys::CRYPTED_KEY, vchPubKey);
    if (!WriteIC(key, std::make_pair(vchCryptedSecret, checksum), false)) {
        // It may already exist, so try writing just the checksum
        std::vector<unsigned char> val;
        if (!m_batch->Read(key, val)) {
            return false;
        }
        if (!WriteIC(key, std::make_pair(val, checksum), true)) {
            return false;
        }
    }
    EraseIC(std::make_pair(DBKeys::KEY, vchPubKey));
    return true;
}